

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O0

void __thiscall
polyscope::CurveNetwork::CurveNetwork
          (CurveNetwork *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *nodes_,vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                  *edges_)

{
  vec<3,_float,_(glm::qualifier)0> value_;
  undefined1 auVar1 [16];
  undefined1 uVar2;
  value_type vVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  char *pcVar4;
  reference pvVar5;
  unsigned_long *puVar6;
  reference pvVar7;
  reference pvVar8;
  vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_> *in_RCX;
  string *in_RSI;
  long *in_RDI;
  string *psVar9;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar10;
  vec3 vVar11;
  ScaledValue<double> SVar12;
  size_t nB;
  size_t nA;
  value_type edge;
  size_t iE;
  size_t maxInd;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_fffffffffffff9b0;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9b8;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *this_01;
  function<void_()> *in_stack_fffffffffffff9c0;
  size_type in_stack_fffffffffffff9c8;
  undefined1 *__n;
  WeakReferrable *in_stack_fffffffffffff9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_fffffffffffff9f8;
  long *__lhs_00;
  string *in_stack_fffffffffffffa00;
  ManagedBufferRegistry *in_stack_fffffffffffffa08;
  string *this_02;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *in_stack_fffffffffffffa10;
  ManagedBufferRegistry *in_stack_fffffffffffffa18;
  allocator *paVar14;
  ScaledValue<float> in_stack_fffffffffffffa20;
  void **in_stack_fffffffffffffa28;
  undefined7 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa37;
  Structure *in_stack_fffffffffffffa38;
  Structure *this_03;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_stack_fffffffffffffa40;
  string local_508 [32];
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  unsigned_long local_348;
  unsigned_long local_340;
  unsigned_long local_338;
  unsigned_long local_330;
  char *local_328;
  size_t local_320;
  undefined1 local_311;
  undefined8 local_310;
  undefined1 local_308 [30];
  undefined1 local_2ea [2];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  ScaledValue<double> local_288;
  ScaledValue<float> local_278;
  string local_270 [32];
  string local_250 [40];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_228;
  undefined8 local_220;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_218;
  undefined8 local_210;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_208;
  string local_200 [32];
  string local_1e0 [40];
  code *local_1b8;
  undefined8 local_1b0;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [48];
  string local_40 [64];
  
  WeakReferrable::WeakReferrable(in_stack_fffffffffffff9d0);
  *in_RDI = 0x98dc38;
  in_RDI[0x12a] = 0x98dcd8;
  std::__cxx11::string::string(local_40,in_RSI);
  (**(code **)(*in_RDI + 0x68))(local_70);
  QuantityStructure<polyscope::CurveNetwork>::QuantityStructure
            ((QuantityStructure<polyscope::CurveNetwork> *)
             CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),in_stack_fffffffffffffa28
             ,(string *)in_stack_fffffffffffffa20,(string *)in_stack_fffffffffffffa18);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_40);
  *in_RDI = 0x98dc38;
  in_RDI[0x12a] = 0x98dcd8;
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffffa38);
  std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             in_stack_fffffffffffff9f8);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffffa38);
  std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            ((ManagedBuffer<unsigned_int> *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
             in_stack_fffffffffffffa00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff9f8);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffffa38);
  std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            ((ManagedBuffer<unsigned_int> *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
             in_stack_fffffffffffffa00,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff9f8);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_130);
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffffa38);
  std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
  local_1b8 = computeEdgeCenters;
  local_1b0 = 0;
  std::bind<void(polyscope::CurveNetwork::*)(),polyscope::CurveNetwork*>
            ((offset_in_CurveNetwork_to_subr *)in_stack_fffffffffffff9b8,
             (CurveNetwork **)in_stack_fffffffffffff9b0);
  std::function<void()>::
  function<std::_Bind<void(polyscope::CurveNetwork::*(polyscope::CurveNetwork*))()>,void>
            (in_stack_fffffffffffff9c0,
             (_Bind<void_(polyscope::CurveNetwork::*(polyscope::CurveNetwork_*))()> *)
             in_stack_fffffffffffff9b8);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)in_stack_fffffffffffffa20,
             in_stack_fffffffffffffa18,(string *)in_stack_fffffffffffffa10,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)in_stack_fffffffffffffa08,(function<void_()> *)in_stack_fffffffffffffa00);
  std::function<void_()>::~function((function<void_()> *)0x4a9491);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_170);
  uVar10 = extraout_XMM0_Qb;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4a94c7);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(in_stack_fffffffffffff9b0,
           (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x4a9507);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x4a9523);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x4a953f);
  Structure::uniquePrefix_abi_cxx11_(in_stack_fffffffffffffa38);
  std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
  vVar11 = getNextUniqueColor();
  local_228 = vVar11.field_2;
  auVar1._8_8_ = uVar10;
  auVar1._0_8_ = vVar11._0_8_;
  local_250._32_8_ = vmovlpd_avx(auVar1);
  value_.field_2 = in_stack_fffffffffffffa40;
  value_._0_8_ = in_stack_fffffffffffffa38;
  local_220 = local_250._32_8_;
  local_218 = local_228;
  local_210 = local_250._32_8_;
  local_208 = local_228;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            ((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)in_stack_fffffffffffffa20,
             (string *)in_stack_fffffffffffffa18,value_);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_200);
  this_03 = (Structure *)(in_RDI + 0x10e);
  Structure::uniquePrefix_abi_cxx11_(this_03);
  std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
  SVar12 = relativeValue<double>(2.41509761878893e-317);
  psVar9 = (string *)SVar12.value;
  uVar2 = SVar12.relativeFlag;
  local_288.relativeFlag = (bool)uVar2;
  local_288.value = (double)psVar9;
  ScaledValue<float>::ScaledValue<double>(&local_278,&local_288);
  PersistentValue<polyscope::ScaledValue<float>_>::PersistentValue
            ((PersistentValue<polyscope::ScaledValue<float>_> *)in_stack_fffffffffffffa18,
             (string *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa20);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_270);
  pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x114);
  Structure::uniquePrefix_abi_cxx11_(this_03);
  std::operator+(in_stack_fffffffffffff9b8,(char *)in_stack_fffffffffffff9b0);
  paVar14 = (allocator *)(local_2ea + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"clay",paVar14);
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::PersistentValue((PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT17(uVar2,in_stack_fffffffffffffa30),psVar9,pbVar13);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)(local_2ea + 1));
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_2c8);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x11d);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x4a97ef);
  __rhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x11f);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x4a9808);
  __lhs_00 = in_RDI + 0x121;
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x4a9821);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x4a983a);
  this_02 = (string *)(in_RDI + 0x125);
  psVar9 = (string *)local_2ea;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_02,"",(allocator *)psVar9);
  std::allocator<char>::~allocator((allocator<char> *)local_2ea);
  *(undefined1 *)(in_RDI + 0x129) = 1;
  pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xff);
  std::vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>::
  size(in_RCX);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff9d0,
             in_stack_fffffffffffff9c8);
  std::vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>::
  size(in_RCX);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff9d0,
             in_stack_fffffffffffff9c8);
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            nNodes((CurveNetwork *)0x4a98f6);
  local_310 = 0;
  __n = &local_311;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x4a991b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,(size_type)__n,(value_type_conflict1 *)in_stack_fffffffffffff9c0,
             (allocator_type *)in_stack_fffffffffffff9b8);
  this_01 = (ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)local_308;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9c0,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9c0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x4a9974);
  local_320 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size(this_01);
  local_328 = (char *)0x0;
  while( true ) {
    __rhs = local_328;
    pcVar4 = (char *)std::
                     vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
                     ::size(in_RCX);
    if (pcVar4 <= __rhs) break;
    pvVar5 = std::
             vector<std::array<unsigned_long,_2UL>,_std::allocator<std::array<unsigned_long,_2UL>_>_>
             ::operator[](in_RCX,(size_type)local_328);
    local_338 = pvVar5->_M_elems[0];
    local_330 = pvVar5->_M_elems[1];
    puVar6 = std::get<0ul,unsigned_long,2ul>((array<unsigned_long,_2UL> *)0x4a9a0c);
    local_340 = *puVar6;
    puVar6 = std::get<1ul,unsigned_long,2ul>((array<unsigned_long,_2UL> *)0x4a9a24);
    local_348 = *puVar6;
    vVar3 = (value_type)local_340;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xff),
                        (size_type)local_328);
    *pvVar7 = vVar3;
    vVar3 = (value_type)local_348;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x102),
                        (size_type)local_328);
    *pvVar7 = vVar3;
    if ((local_320 <= local_340) || (local_320 <= local_348)) {
      std::operator+((char *)__lhs_00,__rhs_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                     __rhs);
      std::__cxx11::to_string((unsigned_long)__lhs);
      std::operator+(__lhs,pbVar13);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                     __rhs);
      std::__cxx11::to_string((unsigned_long)__lhs);
      std::operator+(__lhs,pbVar13);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                     __rhs);
      std::__cxx11::to_string((unsigned_long)__lhs);
      std::operator+(__lhs,pbVar13);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                     __rhs);
      std::__cxx11::to_string((unsigned_long)__lhs);
      std::operator+(__lhs,pbVar13);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                     __rhs);
      exception(psVar9);
      std::__cxx11::string::~string(local_368);
      std::__cxx11::string::~string(local_388);
      std::__cxx11::string::~string(local_508);
      std::__cxx11::string::~string(local_3a8);
      std::__cxx11::string::~string(local_3c8);
      std::__cxx11::string::~string(local_4e8);
      std::__cxx11::string::~string(local_3e8);
      std::__cxx11::string::~string(local_408);
      std::__cxx11::string::~string(local_4c8);
      std::__cxx11::string::~string(local_428);
      std::__cxx11::string::~string(local_448);
      std::__cxx11::string::~string(local_4a8);
      std::__cxx11::string::~string(local_468);
      std::__cxx11::string::~string(local_488);
    }
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xf9),
                        local_340);
    *pvVar8 = *pvVar8 + 1;
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xf9),
                        local_348);
    *pvVar8 = *pvVar8 + 1;
    local_328 = local_328 + 1;
  }
  (**(code **)(*in_RDI + 0x80))();
  return;
}

Assistant:

CurveNetwork::CurveNetwork(std::string name, std::vector<glm::vec3> nodes_, std::vector<std::array<size_t, 2>> edges_)
    : // clang-format off
      QuantityStructure<CurveNetwork>(name, typeName()), 
      nodePositions(this, uniquePrefix() + "nodePositions", nodePositionsData),
      edgeTailInds(this, uniquePrefix() + "edgeTailInds", edgeTailIndsData),
      edgeTipInds(this, uniquePrefix() + "edgeTipInds", edgeTipIndsData),
      edgeCenters(this, uniquePrefix() + "edgeCenters", edgeCentersData, std::bind(&CurveNetwork::computeEdgeCenters, this)),         
      nodePositionsData(std::move(nodes_)), 
      color(uniquePrefix() + "#color", getNextUniqueColor()), 
      radius(uniquePrefix() + "#radius", relativeValue(0.005)),
      material(uniquePrefix() + "#material", "clay")
// clang-format on
{

  // Copy interleaved data in to tip and tails buffers below
  edgeTailIndsData.resize(edges_.size());
  edgeTipIndsData.resize(edges_.size());

  // Compute node degrees; some quantities want them for visualizations
  nodeDegrees = std::vector<size_t>(nNodes(), 0);

  size_t maxInd = nodePositions.size();
  for (size_t iE = 0; iE < edges_.size(); iE++) {
    auto edge = edges_[iE];
    size_t nA = std::get<0>(edge);
    size_t nB = std::get<1>(edge);

    edgeTailIndsData[iE] = nA;
    edgeTipIndsData[iE] = nB;

    // Make sure there are no out of bounds indices
    if (nA >= maxInd || nB >= maxInd) {
      exception("CurveNetwork [" + name + "] edge " + std::to_string(iE) + " has bad node indices { " +
                std::to_string(nA) + " , " + std::to_string(nB) + " } but there are " + std::to_string(maxInd) +
                " nodes.");
    }

    // Increment degree
    nodeDegrees[nA]++;
    nodeDegrees[nB]++;
  }

  updateObjectSpaceBounds();
}